

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STArray.cpp
# Opt level: O0

void __thiscall jbcoin::STArray::STArray(STArray *this,int n)

{
  int n_local;
  STArray *this_local;
  
  STBase::STBase(&this->super_STBase);
  CountedObject<jbcoin::STArray>::CountedObject((CountedObject<jbcoin::STArray> *)this);
  (this->super_STBase)._vptr_STBase = (_func_int **)&PTR__STArray_00519dc8;
  std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::vector(&this->v_);
  std::vector<jbcoin::STObject,_std::allocator<jbcoin::STObject>_>::reserve(&this->v_,(long)n);
  return;
}

Assistant:

STArray::STArray (int n)
{
    v_.reserve(n);
}